

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest_extra.cc
# Opt level: O1

int marshal_digest_algorithm(CBB *cbb,EVP_MD *md,bool with_null)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  bool bVar5;
  long lVar7;
  uint uVar8;
  CBB algorithm;
  CBB oid;
  CBB null;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  bool bVar6;
  
  iVar2 = CBB_add_asn1(cbb,&local_c0,0x20000010);
  uVar8 = 0;
  if ((iVar2 != 0) && (iVar2 = CBB_add_asn1(&local_c0,&local_90,6), iVar2 != 0)) {
    iVar2 = EVP_MD_type((EVP_MD *)md);
    lVar7 = 0;
    bVar6 = false;
    bVar5 = false;
    do {
      iVar1 = *(int *)(kMDOIDs[0].oid + lVar7 + 0xc);
      if (iVar2 == iVar1) {
        iVar3 = CBB_add_bytes(&local_90,kMDOIDs[0].oid + lVar7,(ulong)kMDOIDs[0].oid[lVar7 + 9]);
        bVar5 = bVar6;
        if (iVar3 != 0) {
          bVar5 = true;
        }
        cVar4 = (iVar3 != 0) + '\x01';
        bVar6 = bVar5;
      }
      else {
        cVar4 = '\0';
      }
      if (iVar2 == iVar1) goto LAB_00184938;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x70);
    cVar4 = '\x02';
LAB_00184938:
    uVar8 = 0;
    if (cVar4 == '\x02') {
      if (bVar5) {
        if ((with_null) && (iVar2 = CBB_add_asn1(&local_c0,&local_60,5), iVar2 == 0)) {
          return 0;
        }
        iVar2 = CBB_flush(cbb);
        uVar8 = (uint)(iVar2 != 0);
      }
      else {
        uVar8 = 0;
        ERR_put_error(0x1d,0,0x66,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/digest/digest_extra.cc"
                      ,0xb4);
      }
    }
  }
  return uVar8;
}

Assistant:

static int marshal_digest_algorithm(CBB *cbb, const EVP_MD *md,
                                    bool with_null) {
  CBB algorithm, oid, null;
  if (!CBB_add_asn1(cbb, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&algorithm, &oid, CBS_ASN1_OBJECT)) {
    return 0;
  }

  bool found = false;
  int nid = EVP_MD_type(md);
  for (const auto &mdoid : kMDOIDs) {
    if (nid == mdoid.nid) {
      if (!CBB_add_bytes(&oid, mdoid.oid, mdoid.oid_len)) {
        return 0;
      }
      found = true;
      break;
    }
  }

  if (!found) {
    OPENSSL_PUT_ERROR(DIGEST, DIGEST_R_UNKNOWN_HASH);
    return 0;
  }

  if ((with_null && !CBB_add_asn1(&algorithm, &null, CBS_ASN1_NULL)) ||  //
      !CBB_flush(cbb)) {
    return 0;
  }

  return 1;
}